

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O2

void dump_hex(uint8_t *data,size_t len)

{
  uint8_t uVar1;
  size_t sVar2;
  size_t i;
  ulong uVar3;
  uint8_t *puVar4;
  uint8_t ascii [32];
  
  puVar4 = ascii;
  ascii[0x10] = '\0';
  ascii[0x11] = '\0';
  ascii[0x12] = '\0';
  ascii[0x13] = '\0';
  ascii[0x14] = '\0';
  ascii[0x15] = '\0';
  ascii[0x16] = '\0';
  ascii[0x17] = '\0';
  ascii[0x18] = '\0';
  ascii[0x19] = '\0';
  ascii[0x1a] = '\0';
  ascii[0x1b] = '\0';
  ascii[0x1c] = '\0';
  ascii[0x1d] = '\0';
  ascii[0x1e] = '\0';
  ascii[0x1f] = '\0';
  ascii[0] = '\0';
  ascii[1] = '\0';
  ascii[2] = '\0';
  ascii[3] = '\0';
  ascii[4] = '\0';
  ascii[5] = '\0';
  ascii[6] = '\0';
  ascii[7] = '\0';
  ascii[8] = '\0';
  ascii[9] = '\0';
  ascii[10] = '\0';
  ascii[0xb] = '\0';
  ascii[0xc] = '\0';
  ascii[0xd] = '\0';
  ascii[0xe] = '\0';
  ascii[0xf] = '\0';
  if (len != 0) {
    for (uVar3 = 0; len != uVar3; uVar3 = uVar3 + 1) {
      if ((uVar3 & 0xf) == 0) {
        if (uVar3 != 0) {
          *puVar4 = '\0';
          printf("%s",ascii);
        }
        printf("\n\t%03zu: ",uVar3);
        puVar4 = ascii;
      }
      printf("%02x, ",(ulong)data[uVar3]);
      uVar1 = data[uVar3];
      if (0x5e < (byte)(uVar1 - 0x20)) {
        uVar1 = '.';
      }
      *puVar4 = uVar1;
      puVar4 = puVar4 + 1;
    }
    *puVar4 = '\0';
    if (ascii[0] != '\0') {
      uVar3 = 0;
      while( true ) {
        sVar2 = strnlen((char *)ascii,0x20);
        if (0x10 - sVar2 <= uVar3) break;
        printf("    ");
        uVar3 = uVar3 + 1;
      }
      printf("%s",ascii);
    }
  }
  putchar(10);
  return;
}

Assistant:

void dump_hex(const uint8_t *data, size_t len) {
    uint8_t  ascii[32] = { 0 };
    uint8_t *pascii    = ascii;

    if (len > 0) {
        size_t i;

        for (i = 0; i < len; i++) {
            if (i % 16 == 0) {
                if (i > 0) {
                    *pascii++ = '\0';
                    printf("%s", ascii);
                }
                printf("\n\t%03zu: ", i);
                pascii = ascii;
            }
            printf("%02x, ", data[i]);

            if ((data[i] >= 0x20) && (data[i] < 0x7F)) {
                *pascii++ = data[i];
            } else {
                *pascii++ = '.';
            }
        }
        *pascii++ = '\0';

        if (strnlen((char *)ascii, sizeof(ascii)) > 0) {
            for (i = 0; i < 16 - strnlen((char *)ascii, sizeof(ascii)); i++) {
                printf("    ");
            }
            printf("%s", ascii);
        }
    }
    printf("\n");
}